

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

boolean bydoor(level *lev,xchar x,xchar y)

{
  char cVar1;
  undefined3 in_register_00000031;
  
  if (-1 < x) {
    if ((byte)y < 0x15 && (byte)x < 0x4f) {
      cVar1 = lev->locations[CONCAT31(in_register_00000031,x) + 1][(byte)y].typ;
      if (cVar1 == '\x0f') {
        return '\x01';
      }
      if (cVar1 == '\x17') {
        return '\x01';
      }
    }
    if ((byte)(x - 2U) < 0x4f && (byte)y < 0x15) {
      cVar1 = lev->locations[CONCAT31(in_register_00000031,x) - 1][(byte)y].typ;
      if (cVar1 == '\x0f') {
        return '\x01';
      }
      if (cVar1 == '\x17') {
        return '\x01';
      }
    }
    if (0x4e < (byte)(x - 1U)) {
      return '\0';
    }
    if ((byte)(y + 1U) < 0x15) {
      cVar1 = lev->locations[(byte)x][(long)y + 1].typ;
      if (cVar1 == '\x0f') {
        return '\x01';
      }
      if (cVar1 == '\x17') {
        return '\x01';
      }
    }
    if ((byte)(y - 1U) < 0x15) {
      return (lev->locations[(byte)x][(byte)y - 1].typ - 0xfU & 0xf7) == 0;
    }
  }
  return '\0';
}

Assistant:

static boolean bydoor(struct level *lev, xchar x, xchar y)
{
	int typ;

	if (isok(x+1, y)) {
		typ = lev->locations[x+1][y].typ;
		if (IS_DOOR(typ) || typ == SDOOR) return TRUE;
	}
	if (isok(x-1, y)) {
		typ = lev->locations[x-1][y].typ;
		if (IS_DOOR(typ) || typ == SDOOR) return TRUE;
	}
	if (isok(x, y+1)) {
		typ = lev->locations[x][y+1].typ;
		if (IS_DOOR(typ) || typ == SDOOR) return TRUE;
	}
	if (isok(x, y-1)) {
		typ = lev->locations[x][y-1].typ;
		if (IS_DOOR(typ) || typ == SDOOR) return TRUE;
	}
	return FALSE;
}